

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despot.cpp
# Opt level: O0

double __thiscall
despot::DESPOT::CheckDESPOTSTAR(DESPOT *this,VNode *vnode,double regularized_value)

{
  DSPOMDP *pDVar1;
  undefined8 uVar2;
  int iVar3;
  ostream *poVar4;
  ulong uVar5;
  size_type sVar6;
  const_reference ppSVar7;
  undefined4 extraout_var;
  VNode *pVVar8;
  clock_t cVar9;
  clock_t cVar10;
  clock_t cVar11;
  clock_t cVar12;
  void *this_00;
  double dVar13;
  VNode *cur;
  double start;
  double dStack_90;
  int num_trials;
  double used_time;
  RandomStreams streams;
  VNode *root;
  value_type local_50;
  int local_44;
  undefined1 local_40 [4];
  int i;
  vector<despot::State_*,_std::allocator<despot::State_*>_> copy;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *particles;
  double regularized_value_local;
  VNode *vnode_local;
  DESPOT *this_local;
  
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "--------------------------------------------------------------------------------"
                          );
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  copy.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)VNode::particles(vnode);
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector
            ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_40);
  local_44 = 0;
  while( true ) {
    uVar5 = (ulong)local_44;
    sVar6 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                      ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)
                       copy.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (sVar6 <= uVar5) break;
    pDVar1 = (this->super_Solver).model_;
    ppSVar7 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)
                         copy.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_44);
    iVar3 = (*pDVar1->_vptr_DSPOMDP[0x16])(pDVar1,*ppSVar7);
    local_50 = (value_type)CONCAT44(extraout_var,iVar3);
    std::vector<despot::State_*,_std::allocator<despot::State_*>_>::push_back
              ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_40,&local_50);
    local_44 = local_44 + 1;
  }
  pVVar8 = (VNode *)operator_new(0x98);
  VNode::VNode(pVVar8,(vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_40,0,
               (QNode *)0x0,0xffffffffffffffff);
  streams._24_8_ = pVVar8;
  RandomStreams::RandomStreams((RandomStreams *)&used_time,DAT_00278a6c,DAT_00278a70);
  InitBounds((VNode *)streams._24_8_,this->lower_bound_,this->upper_bound_,
             (RandomStreams *)&used_time,&(this->super_Solver).history_);
  dStack_90 = 0.0;
  start._4_4_ = 0;
  do {
    cVar9 = clock();
    pVVar8 = Trial((VNode *)streams._24_8_,(RandomStreams *)&used_time,this->lower_bound_,
                   this->upper_bound_,(this->super_Solver).model_,&(this->super_Solver).history_,
                   (SearchStatistics *)0x0);
    start._4_4_ = start._4_4_ + 1;
    cVar10 = clock();
    cVar11 = clock();
    Backup(pVVar8);
    cVar12 = clock();
    dStack_90 = ((double)cVar12 - (double)cVar11) / 1000000.0 +
                dStack_90 + ((double)cVar10 - (double)cVar9) / 1000000.0;
    dVar13 = VNode::lower_bound((VNode *)streams._24_8_);
  } while (dVar13 < regularized_value);
  poVar4 = std::operator<<((ostream *)&std::cout,"DESPOT: # trials = ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,start._4_4_);
  poVar4 = std::operator<<(poVar4,"; target = ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,regularized_value);
  poVar4 = std::operator<<(poVar4,", current = ");
  dVar13 = VNode::lower_bound((VNode *)streams._24_8_);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar13);
  poVar4 = std::operator<<(poVar4,", l = ");
  dVar13 = VNode::lower_bound((VNode *)streams._24_8_);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar13);
  poVar4 = std::operator<<(poVar4,", u = ");
  dVar13 = VNode::upper_bound((VNode *)streams._24_8_);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar13);
  poVar4 = std::operator<<(poVar4,"; time = ");
  this_00 = (void *)std::ostream::operator<<(poVar4,dStack_90);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "--------------------------------------------------------------------------------"
                          );
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  VNode::Free((VNode *)streams._24_8_,(this->super_Solver).model_);
  uVar2 = streams._24_8_;
  if (streams._24_8_ != 0) {
    VNode::~VNode((VNode *)streams._24_8_);
    operator_delete((void *)uVar2,0x98);
  }
  RandomStreams::~RandomStreams((RandomStreams *)&used_time);
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::~vector
            ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_40);
  return dStack_90;
}

Assistant:

double DESPOT::CheckDESPOTSTAR(const VNode* vnode, double regularized_value) {
	cout
		<< "--------------------------------------------------------------------------------"
		<< endl;

	const vector<State*>& particles = vnode->particles();
	vector<State*> copy;
	for (int i = 0; i < particles.size(); i++) {
		copy.push_back(model_->Copy(particles[i]));
	}
	VNode* root = new VNode(copy);

	RandomStreams streams = RandomStreams(Globals::config.num_scenarios,
		Globals::config.search_depth);
	InitBounds(root, lower_bound_, upper_bound_, streams, history_);

	double used_time = 0;
	int num_trials = 0;
	do {
		double start = clock();
		VNode* cur = Trial(root, streams, lower_bound_, upper_bound_, model_, history_);
		num_trials++;
		used_time += double(clock() - start) / CLOCKS_PER_SEC;

		start = clock();
		Backup(cur);
		used_time += double(clock() - start) / CLOCKS_PER_SEC;
	} while (root->lower_bound() < regularized_value);

	cout << "DESPOT: # trials = " << num_trials << "; target = "
		<< regularized_value << ", current = " << root->lower_bound()
		<< ", l = " << root->lower_bound() << ", u = " << root->upper_bound()
		<< "; time = " << used_time << endl;
	cout
		<< "--------------------------------------------------------------------------------"
		<< endl;

	root->Free(*model_);
	delete root;

	return used_time;
}